

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_26382a::MkdirCommand::~MkdirCommand(MkdirCommand *this)

{
  MkdirCommand *this_local;
  
  ~MkdirCommand(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getDescription();
  }